

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<double>_>::TransferSolution
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *coarsesol,
          TPZFMatrix<std::complex<double>_> *finesol)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  complex<double> *pcVar6;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  TPZFMatrix<std::complex<double>_> *this_00;
  TPZFMatrix<std::complex<double>_> *extraout_XMM0_Qa;
  TPZFMatrix<std::complex<double>_> *in_XMM1_Qa;
  TPZFMatrix<std::complex<double>_> *pTVar7;
  int c_1;
  int i_1;
  int c;
  int i;
  TPZFMatrix<std::complex<double>_> tempfine;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  int thisc;
  int thisr;
  int ncc;
  int nrc;
  int ncf;
  int nrf;
  int iv;
  complex<double> *in_stack_fffffffffffffe40;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe48;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe50;
  int local_188;
  int local_184;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffebc;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffec0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffec8;
  TPZTransfer<std::complex<double>_> *in_stack_fffffffffffffed0;
  int local_24;
  int local_1c;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDX);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  TPZBaseMatrix::Rows(in_RSI);
  iVar4 = TPZBaseMatrix::Cols(in_RSI);
  iVar1 = (int)iVar4;
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  if (((long)(int)iVar2 != iVar5 * *(int *)&in_RDI->field_0x1c) ||
     (local_24 = (int)iVar3, (int)iVar3 != iVar1)) {
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0xe])
              (in_RDX,(long)((int)iVar2 * *(int *)&in_RDI->field_0x1c),(long)iVar1);
    local_24 = iVar1;
  }
  if (*(int *)&in_RDI->field_0x1c == 1) {
    MultiplyScalar(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffebc);
  }
  else {
    for (local_1c = 0; local_1c < *(int *)&in_RDI->field_0x1c; local_1c = local_1c + 1) {
      TPZFMatrix<std::complex<double>_>::TPZFMatrix
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      TPZFMatrix<std::complex<double>_>::TPZFMatrix
                (in_stack_fffffffffffffea0,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      for (in_stack_fffffffffffffe98 = 0; in_stack_fffffffffffffe98 < (int)iVar4;
          in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + 1) {
        for (in_stack_fffffffffffffe94 = 0; in_stack_fffffffffffffe94 < local_24;
            in_stack_fffffffffffffe94 = in_stack_fffffffffffffe94 + 1) {
          (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (in_RSI,(long)(local_1c +
                                  in_stack_fffffffffffffe98 * *(int *)&in_RDI->field_0x1c),
                     (long)in_stack_fffffffffffffe94);
          pTVar7 = this_00;
          in_stack_fffffffffffffe48 = in_XMM1_Qa;
          in_stack_fffffffffffffe50 = this_00;
          in_stack_fffffffffffffe40 =
               TPZFMatrix<std::complex<double>_>::operator()
                         (this_00,(int64_t)in_XMM1_Qa,(int64_t)in_stack_fffffffffffffe40);
          *(TPZFMatrix<std::complex<double>_> **)in_stack_fffffffffffffe40->_M_value = this_00;
          *(TPZFMatrix<std::complex<double>_> **)(in_stack_fffffffffffffe40->_M_value + 8) =
               in_XMM1_Qa;
          in_XMM1_Qa = pTVar7;
        }
      }
      MultiplyScalar(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffebc);
      for (local_184 = 0; local_184 < (int)iVar4; local_184 = local_184 + 1) {
        for (local_188 = 0; local_188 < local_24; local_188 = local_188 + 1) {
          TPZFMatrix<std::complex<double>_>::GetVal
                    ((TPZFMatrix<std::complex<double>_> *)&stack0xfffffffffffffea8,(long)local_184,
                     (long)local_188);
          pTVar7 = extraout_XMM0_Qa;
          pcVar6 = TPZFMatrix<std::complex<double>_>::operator()
                             (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
                              (int64_t)in_stack_fffffffffffffe40);
          *(TPZFMatrix<std::complex<double>_> **)pcVar6->_M_value = extraout_XMM0_Qa;
          *(TPZFMatrix<std::complex<double>_> **)(pcVar6->_M_value + 8) = in_XMM1_Qa;
          in_XMM1_Qa = pTVar7;
        }
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11d08fa)
      ;
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x11d0907)
      ;
    }
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferSolution(const TPZFMatrix<TVar> &coarsesol, TPZFMatrix<TVar> &finesol){
	int iv;
	int nrf = finesol.Rows();
	int ncf = finesol.Cols();
	int nrc = coarsesol.Rows();
	int ncc = coarsesol.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(nrf != this->Rows()*fNTVarVar || ncf != ncc) {
		nrf = this->Rows()*fNTVarVar;
		ncf = ncc;
		finesol.Redim(nrf,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(coarsesol,finesol,0);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncf);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    tempcoarse(i,c) = coarsesol.GetVal(iv+i*fNTVarVar,c);

                }
            }
            MultiplyScalar(tempcoarse, tempfine, 0);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    finesol(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                    
                }
            }
        }
    }
}